

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::NumberStringBuilder::contentEquals
          (NumberStringBuilder *this,NumberStringBuilder *other)

{
  uint uVar1;
  ValueOrHeapArray<char16_t> *pVVar2;
  ValueOrHeapArray<UNumberFormatFields> *pVVar3;
  ValueOrHeapArray<char16_t> *pVVar4;
  ulong uVar5;
  ValueOrHeapArray<UNumberFormatFields> *pVVar6;
  bool bVar7;
  
  uVar1 = this->fLength;
  if (uVar1 == other->fLength) {
    if ((int)uVar1 < 1) {
      return true;
    }
    bVar7 = this->fUsingHeap != false;
    pVVar2 = &this->fChars;
    if (bVar7) {
      pVVar2 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
    }
    pVVar3 = &this->fFields;
    if (bVar7) {
      pVVar3 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
    }
    bVar7 = other->fUsingHeap != false;
    pVVar4 = &other->fChars;
    if (bVar7) {
      pVVar4 = (ValueOrHeapArray<char16_t> *)(other->fChars).heap.ptr;
    }
    pVVar6 = &other->fFields;
    if (bVar7) {
      pVVar6 = (ValueOrHeapArray<UNumberFormatFields> *)(other->fFields).heap.ptr;
    }
    uVar5 = 0;
    while ((*(short *)((long)pVVar2 + uVar5 * 2 + (long)this->fZero * 2) ==
            *(short *)((long)pVVar4 + uVar5 * 2 + (long)other->fZero * 2) &&
           (*(int *)((long)pVVar3 + uVar5 * 4 + (long)this->fZero * 4) ==
            *(int *)((long)pVVar6 + uVar5 * 4 + (long)other->fZero * 4)))) {
      uVar5 = uVar5 + 1;
      if (uVar1 == uVar5) {
        return uVar1 <= uVar5;
      }
    }
  }
  return false;
}

Assistant:

bool NumberStringBuilder::contentEquals(const NumberStringBuilder &other) const {
    if (fLength != other.fLength) {
        return false;
    }
    for (int32_t i = 0; i < fLength; i++) {
        if (charAt(i) != other.charAt(i) || fieldAt(i) != other.fieldAt(i)) {
            return false;
        }
    }
    return true;
}